

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

lys_module * lys_parse_path(ly_ctx *ctx,char *path,LYS_INFORMAT format)

{
  char cVar1;
  undefined8 uVar2;
  int iVar3;
  lys_module *plVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  size_t __n;
  char *pcVar8;
  int *piVar9;
  char *pcVar10;
  char local_1048 [8];
  char rpath [4096];
  
  if (ctx == (ly_ctx *)0x0 || path == (char *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lys_parse_path");
    return (lys_module *)0x0;
  }
  iVar3 = open(path,0);
  if (iVar3 == -1) {
    piVar9 = __errno_location();
    pcVar10 = strerror(*piVar9);
    ly_log(ctx,LY_LLERR,LY_ESYS,"Opening file \"%s\" failed (%s).",path,pcVar10);
    return (lys_module *)0x0;
  }
  plVar4 = lys_parse_fd_(ctx,iVar3,format,(char *)0x0,1);
  close(iVar3);
  if (plVar4 == (lys_module *)0x0) {
    return (lys_module *)0x0;
  }
  pcVar5 = strrchr(path,0x2f);
  pcVar10 = pcVar5 + 1;
  if (pcVar5 == (char *)0x0) {
    pcVar10 = path;
  }
  pcVar6 = strchr(pcVar10,0x40);
  pcVar7 = strrchr(pcVar10,0x2e);
  pcVar5 = plVar4->name;
  rpath._4088_8_ = plVar4;
  __n = strlen(pcVar5);
  iVar3 = strncmp(pcVar10,pcVar5,__n);
  if (iVar3 == 0) {
    pcVar8 = pcVar6;
    if (pcVar6 == (char *)0x0) {
      pcVar8 = pcVar7;
    }
    if (pcVar10 + __n == pcVar8) goto LAB_0015ec4b;
  }
  ly_log(ctx,LY_LLWRN,LY_SUCCESS,"File name \"%s\" does not match module name \"%s\".",pcVar10,
         pcVar5);
LAB_0015ec4b:
  uVar2 = rpath._4088_8_;
  if ((pcVar6 != (char *)0x0) &&
     (((cVar1 = *(char *)(rpath._4088_8_ + 0x44), cVar1 == '\0' ||
       ((long)pcVar7 - (long)(pcVar6 + 1) != 10)) ||
      (iVar3 = strncmp(*(char **)(rpath._4088_8_ + 0x58),pcVar6 + 1,10), iVar3 != 0)))) {
    if (cVar1 == '\0') {
      pcVar5 = "none";
    }
    else {
      pcVar5 = *(char **)(uVar2 + 0x58);
    }
    ly_log(ctx,LY_LLWRN,LY_SUCCESS,"File name \"%s\" does not match module revision \"%s\".",pcVar10
           ,pcVar5);
  }
  if (*(long *)(uVar2 + 0x38) == 0) {
    pcVar5 = realpath(path,local_1048);
    pcVar10 = local_1048;
    if (pcVar5 == (char *)0x0) {
      pcVar10 = path;
    }
    pcVar10 = lydict_insert(ctx,pcVar10,0);
    *(char **)(uVar2 + 0x38) = pcVar10;
  }
  return (lys_module *)uVar2;
}

Assistant:

lys_module *
lys_parse_path(struct ly_ctx *ctx, const char *path, LYS_INFORMAT format)
{
    int fd;
    const struct lys_module *ret;
    const char *rev, *dot, *filename;
    size_t len;

    if (!ctx || !path) {
        LOGARG;
        return NULL;
    }

    fd = open(path, O_RDONLY);
    if (fd == -1) {
        LOGERR(ctx, LY_ESYS, "Opening file \"%s\" failed (%s).", path, strerror(errno));
        return NULL;
    }

    ret = lys_parse_fd(ctx, fd, format);
    close(fd);

    if (!ret) {
        /* error */
        return NULL;
    }

    /* check that name and revision match filename */
    filename = strrchr(path, '/');
    if (!filename) {
        filename = path;
    } else {
        filename++;
    }
    rev = strchr(filename, '@');
    dot = strrchr(filename, '.');

    /* name */
    len = strlen(ret->name);
    if (strncmp(filename, ret->name, len) ||
            ((rev && rev != &filename[len]) || (!rev && dot != &filename[len]))) {
        LOGWRN(ctx, "File name \"%s\" does not match module name \"%s\".", filename, ret->name);
    }
    if (rev) {
        len = dot - ++rev;
        if (!ret->rev_size || len != 10 || strncmp(ret->rev[0].date, rev, len)) {
            LOGWRN(ctx, "File name \"%s\" does not match module revision \"%s\".", filename,
                   ret->rev_size ? ret->rev[0].date : "none");
        }
    }

    if (!ret->filepath) {
        /* store URI */
        char rpath[PATH_MAX];
        if (realpath(path, rpath) != NULL) {
            ((struct lys_module *)ret)->filepath = lydict_insert(ctx, rpath, 0);
        } else {
            ((struct lys_module *)ret)->filepath = lydict_insert(ctx, path, 0);
        }
    }

    return ret;
}